

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::OnShutdown(_func_void *func)

{
  MutexLock local_18;
  MutexLock lock;
  _func_void *func_local;
  
  lock.mu_ = (Mutex *)func;
  InitShutdownFunctionsOnce();
  MutexLock::MutexLock(&local_18,shutdown_functions_mutex);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back
            (shutdown_functions,(value_type *)&lock);
  MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void OnShutdown(void (*func)()) {
  InitShutdownFunctionsOnce();
  MutexLock lock(shutdown_functions_mutex);
  shutdown_functions->push_back(func);
}